

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O2

void Commands::Ban(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *arguments,Command_Source *from,bool announce)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Character *victim;
  undefined4 extraout_var_00;
  mapped_type *this;
  uint uVar4;
  double dVar5;
  allocator<char> local_a9;
  string local_a8;
  key_type local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48;
  
  iVar3 = (*from->_vptr_Command_Source[4])(from);
  std::__cxx11::string::string
            ((string *)&local_48,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  victim = World::GetCharacter((World *)CONCAT44(extraout_var,iVar3),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pbVar1 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(arguments->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    iVar3 = (*from->_vptr_Command_Source[4])(from);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"DefaultBanLength",&local_a9);
    this = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(CONCAT44(extraout_var_00,iVar3) + 0x198),&local_88);
    util::variant::GetString_abi_cxx11_(&local_a8,this);
    dVar5 = util::tdparse(&local_a8);
    uVar4 = (uint)dVar5;
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    util::lowercase(&local_a8,pbVar1 + 1);
    bVar2 = std::operator!=(&local_a8,"forever");
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar2) {
      dVar5 = util::tdparse((arguments->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
      uVar4 = (uint)dVar5;
    }
    else {
      uVar4 = 0xffffffff;
    }
  }
  local_68._8_8_ = 0;
  local_68._4_4_ = 0;
  local_68._0_4_ = uVar4;
  local_50 = std::
             _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/commands/moderation.cpp:65:30)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/commands/moderation.cpp:65:30)>
             ::_M_manager;
  do_punishment(from,victim,
                (function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *)&local_68,announce)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

void Ban(const std::vector<std::string>& arguments, Command_Source* from, bool announce = true)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);
	int duration = -1;

	if (arguments.size() >= 2)
	{
		if (util::lowercase(arguments[1]) != "forever")
			duration = int(util::tdparse(arguments[1]));
	}
	else
	{
		duration = int(util::tdparse(from->SourceWorld()->config["DefaultBanLength"]));
	}

	do_punishment(from, victim, [duration](World* world, Command_Source* from, Character* victim, bool announce)
		{
			world->Ban(from, victim, duration, announce);
		}, announce);
}